

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.c
# Opt level: O0

int mbedtls_pk_setup_rsa_alt
              (mbedtls_pk_context *ctx,void *key,mbedtls_pk_rsa_alt_decrypt_func decrypt_func,
              mbedtls_pk_rsa_alt_sign_func sign_func,mbedtls_pk_rsa_alt_key_len_func key_len_func)

{
  undefined8 *puVar1;
  void *pvVar2;
  mbedtls_pk_info_t *info;
  mbedtls_rsa_alt_context *rsa_alt;
  mbedtls_pk_rsa_alt_key_len_func key_len_func_local;
  mbedtls_pk_rsa_alt_sign_func sign_func_local;
  mbedtls_pk_rsa_alt_decrypt_func decrypt_func_local;
  void *key_local;
  mbedtls_pk_context *ctx_local;
  
  if (ctx->pk_info == (mbedtls_pk_info_t *)0x0) {
    pvVar2 = rsa_alt_alloc_wrap();
    ctx->pk_ctx = pvVar2;
    if (pvVar2 == (void *)0x0) {
      ctx_local._4_4_ = -0x3f80;
    }
    else {
      ctx->pk_info = &mbedtls_rsa_alt_info;
      puVar1 = (undefined8 *)ctx->pk_ctx;
      *puVar1 = key;
      puVar1[1] = decrypt_func;
      puVar1[2] = sign_func;
      puVar1[3] = key_len_func;
      ctx_local._4_4_ = 0;
    }
  }
  else {
    ctx_local._4_4_ = -16000;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_pk_setup_rsa_alt( mbedtls_pk_context *ctx, void * key,
                         mbedtls_pk_rsa_alt_decrypt_func decrypt_func,
                         mbedtls_pk_rsa_alt_sign_func sign_func,
                         mbedtls_pk_rsa_alt_key_len_func key_len_func )
{
    mbedtls_rsa_alt_context *rsa_alt;
    const mbedtls_pk_info_t *info = &mbedtls_rsa_alt_info;

    PK_VALIDATE_RET( ctx != NULL );
    if( ctx->pk_info != NULL )
        return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );

    if( ( ctx->pk_ctx = info->ctx_alloc_func() ) == NULL )
        return( MBEDTLS_ERR_PK_ALLOC_FAILED );

    ctx->pk_info = info;

    rsa_alt = (mbedtls_rsa_alt_context *) ctx->pk_ctx;

    rsa_alt->key = key;
    rsa_alt->decrypt_func = decrypt_func;
    rsa_alt->sign_func = sign_func;
    rsa_alt->key_len_func = key_len_func;

    return( 0 );
}